

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activation.cpp
# Opt level: O3

int __thiscall Activation::remove(Activation *this,char *__filename)

{
  pointer pFVar1;
  ulong uVar2;
  void *pvVar3;
  pointer pFVar4;
  pointer __src;
  
  uVar2 = (ulong)__filename & 0xffffffff;
  pFVar1 = (this->m_params).super__Vector_base<Func_Param,_std::allocator<Func_Param>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar4 = (this->m_params).super__Vector_base<Func_Param,_std::allocator<Func_Param>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (uVar2 < (ulong)((long)pFVar4 - (long)pFVar1 >> 5)) {
    pvVar3 = (void *)(uVar2 * 0x20);
    __src = (pointer)((long)pvVar3 + (long)(pFVar1 + 1));
    if (__src != pFVar4) {
      pvVar3 = memmove(pFVar1 + uVar2,__src,(long)pFVar4 - (long)__src);
      pFVar4 = (this->m_params).super__Vector_base<Func_Param,_std::allocator<Func_Param>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    (this->m_params).super__Vector_base<Func_Param,_std::allocator<Func_Param>_>._M_impl.
    super__Vector_impl_data._M_finish = pFVar4 + -1;
    return (int)pvVar3;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [activation removal]: Index out of bounds!\n");
  exit(1);
}

Assistant:

void Activation::remove(unsigned index){
    if(index>=m_params.size()){
        std::cout<<"ERROR [activation removal]: Index out of bounds!\n";
        exit(1);
    }

    m_params.erase(m_params.begin()+index);
}